

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O0

double __thiscall Clasp::ClaspFacade::SolveData::BoundArray::_at(BoundArray *this,uint32_t idx)

{
  uint32 uVar1;
  wsum_t wVar2;
  wsum_t wVar3;
  uint in_ESI;
  uint32 unaff_retaddr;
  Type unaff_retaddr_00;
  SolveData *in_stack_00000008;
  wsum_t bound;
  double local_38;
  
  uVar1 = size((BoundArray *)0x1304e4);
  if (uVar1 <= in_ESI) {
    Potassco::fail(-2,"double Clasp::ClaspFacade::SolveData::BoundArray::_at(uint32_t) const",0x1c6,
                   "idx < size()","expired key",0);
  }
  wVar2 = _bound(in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
  wVar3 = SharedMinimizeData::maxBound();
  if (wVar2 == wVar3) {
    local_38 = std::numeric_limits<double>::infinity();
  }
  else {
    local_38 = (double)wVar2;
  }
  return local_38;
}

Assistant:

double _at(uint32_t idx) const {
			POTASSCO_REQUIRE(idx < size(), "expired key");
			const wsum_t bound = data->_bound(type, idx);
			return bound != SharedMinimizeData::maxBound()
				? static_cast<double>(bound)
				: std::numeric_limits<double>::infinity();
		}